

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::MaskProportionalityCase::iterate(MaskProportionalityCase *this)

{
  float fVar1;
  size_t this_00;
  int iVar2;
  GLenum GVar3;
  deBool dVar4;
  int iVar5;
  MessageBuilder *pMVar6;
  float *pfVar7;
  TestContext *pTVar8;
  int precision;
  int precision_00;
  int precision_01;
  char *local_10b8;
  float local_1020;
  char *local_fb8;
  MessageBuilder local_fb0;
  MessageBuilder local_e30;
  MessageBuilder local_cb0;
  undefined4 local_b2c;
  MessageBuilder local_b28;
  string local_9a8;
  MessageBuilder local_988;
  RGBA local_804;
  int local_800;
  int local_7fc;
  int x;
  int y;
  deInt32 sumRed;
  allocator<char> local_7c9;
  string local_7c8;
  LogImage local_7a8;
  char *local_718;
  string local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  MessageBuilder local_6d0;
  float local_550;
  byte local_549;
  float coverageValue;
  bool isInverted;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  MessageBuilder local_508;
  float local_384;
  undefined1 local_380 [4];
  float alphaOrCoverageValue;
  Vec4 quadColor;
  Vec2 pt3;
  Vec2 pt2;
  Vec2 pt1;
  Vec2 pt0;
  MessageBuilder local_1d0;
  int local_3c;
  undefined1 local_38 [4];
  deInt32 numPixels;
  Surface renderedImg;
  TestLog *log;
  MaskProportionalityCase *this_local;
  
  renderedImg.m_pixels.m_cap =
       (size_t)tcu::TestContext::getLog
                         ((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode
                          .m_testCtx);
  iVar2 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface((Surface *)local_38,iVar2,iVar2);
  iVar2 = tcu::Surface::getWidth((Surface *)local_38);
  local_3c = tcu::Surface::getHeight((Surface *)local_38);
  local_3c = iVar2 * local_3c;
  tcu::TestLog::operator<<
            (&local_1d0,(TestLog *)renderedImg.m_pixels.m_cap,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [24])"Clearing color to black");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  do {
    glwColorMask('\x01','\x01','\x01','\x01');
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x473);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    glwClearColor(0.0,0.0,0.0,1.0);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glClearColor(0.0f, 0.0f, 0.0f, 1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x474);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    glwClear(0x4000);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glClear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x475);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  if (this->m_type == CASETYPE_ALPHA_TO_COVERAGE) {
    do {
      glwColorMask('\x01','\x01','\x01','\0');
      GVar3 = glwGetError();
      glu::checkError(GVar3,"glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_FALSE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                      ,0x479);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&pt0,(TestLog *)renderedImg.m_pixels.m_cap,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&pt0,
                        (char (*) [41])"Using color mask TRUE, TRUE, TRUE, FALSE");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&pt0);
  }
  tcu::Vector<float,_2>::Vector(&pt1,-1.0,-1.0);
  tcu::Vector<float,_2>::Vector(&pt2,1.0,-1.0);
  tcu::Vector<float,_2>::Vector(&pt3,-1.0,1.0);
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(quadColor.m_data + 2),1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_380,1.0,0.0,0.0,1.0);
  local_384 = (float)this->m_currentIteration / (float)(this->m_numIterations + -1);
  if (this->m_type == CASETYPE_ALPHA_TO_COVERAGE) {
    tcu::TestLog::operator<<
              (&local_508,(TestLog *)renderedImg.m_pixels.m_cap,
               (BeginMessageToken *)&tcu::TestLog::Message);
    de::floatToString_abi_cxx11_((string *)&coverageValue,(de *)0x2,local_384,precision);
    std::operator+(&local_528,"Drawing a red quad using alpha value ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &coverageValue);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_508,&local_528);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&coverageValue);
    tcu::MessageBuilder::~MessageBuilder(&local_508);
    fVar1 = local_384;
    pfVar7 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_380);
    *pfVar7 = fVar1;
  }
  else {
    local_549 = this->m_type == CASETYPE_SAMPLE_COVERAGE_INVERTED;
    local_1020 = local_384;
    if ((bool)local_549) {
      local_1020 = 1.0 - local_384;
    }
    local_550 = local_1020;
    tcu::TestLog::operator<<
              (&local_6d0,(TestLog *)renderedImg.m_pixels.m_cap,
               (BeginMessageToken *)&tcu::TestLog::Message);
    de::floatToString_abi_cxx11_(&local_710,(de *)0x2,local_550,precision_00);
    std::operator+(&local_6f0,"Drawing a red quad using sample coverage value ",&local_710);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_6d0,&local_6f0);
    local_718 = "";
    if ((local_549 & 1) != 0) {
      local_718 = " (inverted)";
    }
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_718);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_6f0);
    std::__cxx11::string::~string((string *)&local_710);
    tcu::MessageBuilder::~MessageBuilder(&local_6d0);
    do {
      glwSampleCoverage(local_550,local_549 & 1);
      GVar3 = glwGetError();
      glu::checkError(GVar3,"glSampleCoverage(coverageValue, isInverted ? GL_TRUE : GL_FALSE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                      ,0x493);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
  }
  MultisampleCase::renderQuad
            (&this->super_MultisampleCase,&pt1,&pt2,&pt3,(Vec2 *)(quadColor.m_data + 2),
             (Vec4 *)local_380);
  MultisampleCase::readImage(&this->super_MultisampleCase,(Surface *)local_38);
  this_00 = renderedImg.m_pixels.m_cap;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c8,"RenderedImage",&local_7c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sumRed,"Rendered image",(allocator<char> *)((long)&y + 3));
  tcu::LogImage::LogImage
            (&local_7a8,&local_7c8,(string *)&sumRed,(Surface *)local_38,
             QP_IMAGE_COMPRESSION_MODE_PNG);
  tcu::TestLog::operator<<((TestLog *)this_00,&local_7a8);
  tcu::LogImage::~LogImage(&local_7a8);
  std::__cxx11::string::~string((string *)&sumRed);
  std::allocator<char>::~allocator((allocator<char> *)((long)&y + 3));
  std::__cxx11::string::~string((string *)&local_7c8);
  std::allocator<char>::~allocator(&local_7c9);
  x = 0;
  for (local_7fc = 0; iVar2 = local_7fc, iVar5 = tcu::Surface::getHeight((Surface *)local_38),
      iVar2 < iVar5; local_7fc = local_7fc + 1) {
    for (local_800 = 0; iVar2 = local_800, iVar5 = tcu::Surface::getWidth((Surface *)local_38),
        iVar2 < iVar5; local_800 = local_800 + 1) {
      local_804 = tcu::Surface::getPixel((Surface *)local_38,local_800,local_7fc);
      iVar2 = tcu::RGBA::getRed(&local_804);
      x = iVar2 + x;
    }
  }
  tcu::TestLog::operator<<
            (&local_988,(TestLog *)renderedImg.m_pixels.m_cap,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_988,(char (*) [30])"Average red color component: ");
  de::floatToString_abi_cxx11_
            (&local_9a8,(de *)0x2,((float)x / 255.0) / (float)local_3c,precision_01);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_9a8);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_9a8);
  tcu::MessageBuilder::~MessageBuilder(&local_988);
  if (x < this->m_previousIterationColorSum) {
    tcu::TestLog::operator<<
              (&local_b28,(TestLog *)renderedImg.m_pixels.m_cap,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_b28,
                        (char (*) [68])
                        "Failure: Current average red color component is lower than previous");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_b28);
    pTVar8 = Context::getTestContext((this->super_MultisampleCase).super_TestCase.m_context);
    tcu::TestContext::setTestResult(pTVar8,QP_TEST_RESULT_FAIL,"Failed");
    this_local._4_4_ = STOP;
  }
  else if ((this->m_currentIteration == 0) && (x != 0)) {
    tcu::TestLog::operator<<
              (&local_cb0,(TestLog *)renderedImg.m_pixels.m_cap,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_cb0,(char (*) [42])"Failure: Image should be completely black");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_cb0);
    pTVar8 = Context::getTestContext((this->super_MultisampleCase).super_TestCase.m_context);
    tcu::TestContext::setTestResult(pTVar8,QP_TEST_RESULT_FAIL,"Failed");
    this_local._4_4_ = STOP;
  }
  else if ((this->m_currentIteration == this->m_numIterations + -1) && (x != local_3c * 0xff)) {
    tcu::TestLog::operator<<
              (&local_e30,(TestLog *)renderedImg.m_pixels.m_cap,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_e30,(char (*) [40])"Failure: Image should be completely red");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_e30);
    pTVar8 = Context::getTestContext((this->super_MultisampleCase).super_TestCase.m_context);
    tcu::TestContext::setTestResult(pTVar8,QP_TEST_RESULT_FAIL,"Failed");
    this_local._4_4_ = STOP;
  }
  else {
    this->m_previousIterationColorSum = x;
    this->m_currentIteration = this->m_currentIteration + 1;
    if (this->m_currentIteration < this->m_numIterations) {
      this_local._4_4_ = CONTINUE;
    }
    else {
      tcu::TestLog::operator<<
                (&local_fb0,(TestLog *)renderedImg.m_pixels.m_cap,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_fb0,
                          (char (*) [86])
                          "Success: Number of coverage mask bits set appears to be, on average, proportional to "
                         );
      if (this->m_type == CASETYPE_ALPHA_TO_COVERAGE) {
        local_10b8 = "alpha";
      }
      else {
        local_10b8 = "inverted sample coverage value";
        if (this->m_type == CASETYPE_SAMPLE_COVERAGE) {
          local_10b8 = "sample coverage value";
        }
      }
      local_fb8 = local_10b8;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_fb8);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_fb0);
      pTVar8 = Context::getTestContext((this->super_MultisampleCase).super_TestCase.m_context);
      tcu::TestContext::setTestResult(pTVar8,QP_TEST_RESULT_PASS,"Passed");
      this_local._4_4_ = STOP;
    }
  }
  local_b2c = 1;
  tcu::Surface::~Surface((Surface *)local_38);
  return this_local._4_4_;
}

Assistant:

MaskProportionalityCase::IterateResult MaskProportionalityCase::iterate (void)
{
	TestLog&		log				= m_testCtx.getLog();
	tcu::Surface	renderedImg		(m_viewportSize, m_viewportSize);
	deInt32			numPixels		= (deInt32)renderedImg.getWidth()*(deInt32)renderedImg.getHeight();

	log << TestLog::Message << "Clearing color to black" << TestLog::EndMessage;
	GLU_CHECK_CALL(glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE));
	GLU_CHECK_CALL(glClearColor(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));

	if (m_type == CASETYPE_ALPHA_TO_COVERAGE)
	{
		GLU_CHECK_CALL(glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_FALSE));
		log << TestLog::Message << "Using color mask TRUE, TRUE, TRUE, FALSE" << TestLog::EndMessage;
	}

	// Draw quad.

	{
		const Vec2		pt0						(-1.0f, -1.0f);
		const Vec2		pt1						( 1.0f, -1.0f);
		const Vec2		pt2						(-1.0f,  1.0f);
		const Vec2		pt3						( 1.0f,  1.0f);
		Vec4			quadColor				(1.0f, 0.0f, 0.0f, 1.0f);
		float			alphaOrCoverageValue	= (float)m_currentIteration / (float)(m_numIterations-1);

		if (m_type == CASETYPE_ALPHA_TO_COVERAGE)
		{
			log << TestLog::Message << "Drawing a red quad using alpha value " + de::floatToString(alphaOrCoverageValue, 2) << TestLog::EndMessage;
			quadColor.w() = alphaOrCoverageValue;
		}
		else
		{
			DE_ASSERT(m_type == CASETYPE_SAMPLE_COVERAGE || m_type == CASETYPE_SAMPLE_COVERAGE_INVERTED);

			bool	isInverted		= m_type == CASETYPE_SAMPLE_COVERAGE_INVERTED;
			float	coverageValue	= isInverted ? 1.0f - alphaOrCoverageValue : alphaOrCoverageValue;
			log << TestLog::Message << "Drawing a red quad using sample coverage value " + de::floatToString(coverageValue, 2) << (isInverted ? " (inverted)" : "") << TestLog::EndMessage;
			GLU_CHECK_CALL(glSampleCoverage(coverageValue, isInverted ? GL_TRUE : GL_FALSE));
		}

		renderQuad(pt0, pt1, pt2, pt3, quadColor);
	}

	// Read ang log image.

	readImage(renderedImg);

	log << TestLog::Image("RenderedImage", "Rendered image", renderedImg, QP_IMAGE_COMPRESSION_MODE_PNG);

	// Compute average red component in rendered image.

	deInt32 sumRed = 0;

	for (int y = 0; y < renderedImg.getHeight(); y++)
	for (int x = 0; x < renderedImg.getWidth(); x++)
		sumRed += renderedImg.getPixel(x, y).getRed();

	log << TestLog::Message << "Average red color component: " << de::floatToString((float)sumRed / 255.0f / (float)numPixels, 2) << TestLog::EndMessage;

	// Check if average color has decreased from previous frame's color.

	if (sumRed < m_previousIterationColorSum)
	{
		log << TestLog::Message << "Failure: Current average red color component is lower than previous" << TestLog::EndMessage;
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
		return STOP;
	}

	// Check if coverage mask is not all-zeros if alpha or coverage value is 0 (or 1, if inverted).

	if (m_currentIteration == 0 && sumRed != 0)
	{
		log << TestLog::Message << "Failure: Image should be completely black" << TestLog::EndMessage;
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
		return STOP;
	}

	if (m_currentIteration == m_numIterations-1 && sumRed != 0xff*numPixels)
	{
		log << TestLog::Message << "Failure: Image should be completely red" << TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
		return STOP;
	}

	m_previousIterationColorSum = sumRed;

	m_currentIteration++;

	if (m_currentIteration >= m_numIterations)
	{
		log << TestLog::Message
			<< "Success: Number of coverage mask bits set appears to be, on average, proportional to "
			<< (m_type == CASETYPE_ALPHA_TO_COVERAGE ? "alpha" : m_type == CASETYPE_SAMPLE_COVERAGE ? "sample coverage value" : "inverted sample coverage value")
			<< TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Passed");
		return STOP;
	}
	else
		return CONTINUE;
}